

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderStartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  long lVar1;
  xmlTextReaderPtr reader;
  xmlParserCtxtPtr ctxt;
  xmlChar **atts_local;
  xmlChar *fullname_local;
  void *ctx_local;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if ((((lVar1 != 0) && (*(long *)(lVar1 + 0x38) != 0)) &&
      ((**(code **)(lVar1 + 0x38))(ctx,fullname,atts), *(long *)((long)ctx + 0x50) != 0)) &&
     (((*(long *)((long)ctx + 0x38) != 0 && (*(long *)(*(long *)((long)ctx + 0x38) + 0x20) != 0)) &&
      ((**(char **)(*(long *)((long)ctx + 0x38) + 0x20) == '/' &&
       (*(char *)(*(long *)(*(long *)((long)ctx + 0x38) + 0x20) + 1) == '>')))))) {
    *(undefined2 *)(*(long *)((long)ctx + 0x50) + 0x72) = 1;
  }
  if (lVar1 != 0) {
    *(undefined4 *)(lVar1 + 0x18) = 1;
  }
  return;
}

Assistant:

static void
xmlTextReaderStartElement(void *ctx, const xmlChar *fullname,
	                  const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlTextReaderPtr reader = ctxt->_private;

    if ((reader != NULL) && (reader->startElement != NULL)) {
	reader->startElement(ctx, fullname, atts);
	if ((ctxt->node != NULL) && (ctxt->input != NULL) &&
	    (ctxt->input->cur != NULL) && (ctxt->input->cur[0] == '/') &&
	    (ctxt->input->cur[1] == '>'))
	    ctxt->node->extra = NODE_IS_EMPTY;
    }
    if (reader != NULL)
	reader->state = XML_TEXTREADER_ELEMENT;
}